

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytracer.h
# Opt level: O0

OutputImage<cert::Color,_120UL,_120UL> * cert::raytrace<120ul,120ul,120ul,120ul,0ul,0ul,3ul>(void)

{
  Vec3 lookfrom_00;
  float x;
  Color CVar1;
  OutputImage<cert::Color,_120UL,_120UL> *in_RDI;
  float fVar2;
  Vec3 VVar3;
  float local_aa64;
  float local_aa5c;
  Color local_aa3b;
  Vec3 local_aa38;
  Vec3 local_aa28;
  undefined1 local_aa1c [8];
  Ray r;
  float v;
  float u;
  float sY;
  float sX;
  Vec3 color;
  int j;
  int i;
  OutputImage<cert::Color,_120UL,_120UL> framebuffer;
  undefined1 local_c4 [8];
  Camera cam;
  Vec3 lookat;
  Vec3 lookfrom;
  undefined1 local_70 [8];
  World world;
  
  World::World((World *)local_70);
  setup_scene((World *)local_70);
  Vec3::Vec3((Vec3 *)&lookat.y,0.0,1.0,3.0);
  Vec3::Vec3((Vec3 *)&cam.vertical.y,0.0,0.0,0.0);
  lookfrom_00.z = lookfrom.x;
  lookfrom_00.x = lookat.y;
  lookfrom_00.y = lookat.z;
  VVar3.z = lookat.x;
  VVar3.x = cam.vertical.y;
  VVar3.y = cam.vertical.z;
  framebuffer.data._M_elems[0x383d].g = '\0';
  framebuffer.data._M_elems[0x383d].b = '\0';
  framebuffer.data._M_elems[0x383e].r = '\0';
  framebuffer.data._M_elems[0x383e].g = '\0';
  framebuffer.data._M_elems[0x383e].b = '\0';
  framebuffer.data._M_elems[0x383f].r = '\0';
  framebuffer.data._M_elems[0x383f].g = 0x80;
  framebuffer.data._M_elems[0x383f].b = '?';
  Camera::Camera((Camera *)local_c4,lookfrom_00,VVar3,(Vec3)ZEXT812(0x3f80000000000000),90.0,1.0);
  OutputImage<cert::Color,_120UL,_120UL>::OutputImage((OutputImage<cert::Color,_120UL,_120UL> *)&j);
  for (color.z = 0.0; (uint)color.z < 0x78; color.z = (float)((int)color.z + 1)) {
    for (color.y = 0.0; (uint)color.y < 0x78; color.y = (float)((int)color.y + 1)) {
      Vec3::Vec3((Vec3 *)&sY,0.0,0.0,0.0);
      for (u = 0.0; u < 1.0; u = u + 0.33333334) {
        for (v = 0.0; v < 1.0; v = v + 0.33333334) {
          fVar2 = (float)((ulong)((uint)color.z & 1) | (ulong)(long)(int)color.z >> 1);
          local_aa5c = fVar2 + fVar2;
          if (-1 < (long)(int)color.z) {
            local_aa5c = (float)(int)color.z;
          }
          r.direction.z = (local_aa5c + u) / 120.0;
          fVar2 = (float)((ulong)((uint)color.y & 1) | (ulong)(long)(int)color.y >> 1);
          local_aa64 = fVar2 + fVar2;
          if (-1 < (long)(int)color.y) {
            local_aa64 = (float)(int)color.y;
          }
          r.direction.y = (local_aa64 + v) / 120.0;
          Camera::get_ray((Ray *)local_aa1c,(Camera *)local_c4,r.direction.z,r.direction.y);
          VVar3 = trace((Ray *)local_aa1c,(World *)local_70,0);
          local_aa38.z = VVar3.z;
          local_aa38._0_8_ = VVar3._0_8_;
          local_aa28._0_8_ = local_aa38._0_8_;
          local_aa28.z = local_aa38.z;
          Vec3::operator+=((Vec3 *)&sY,&local_aa28);
        }
      }
      Vec3::operator/=((Vec3 *)&sY,9.0);
      x = color.z;
      fVar2 = color.y;
      CVar1 = vec_to_color((Vec3 *)&sY);
      local_aa3b._0_2_ = CVar1._0_2_;
      local_aa3b.b = CVar1.b;
      OutputImage<cert::Color,_120UL,_120UL>::set
                ((OutputImage<cert::Color,_120UL,_120UL> *)&j,(int)x,(int)fVar2,&local_aa3b);
    }
  }
  memcpy(in_RDI,&j,0xa8c0);
  World::~World((World *)local_70);
  return in_RDI;
}

Assistant:

constexpr auto raytrace ()
{
	World world{};
	// setup_simple_scene (world);
	setup_scene (world);
	Vec3 lookfrom{ 0, 1, 3 };
	Vec3 lookat{ 0, 0, 0 };
	Camera cam{ lookfrom, lookat, VEC3_UP, 90, static_cast<float> (width) / static_cast<float> (height) };

	OutputImage<Color, x_size, y_size> framebuffer{};
	for (int i = 0; i < x_size; i++)
	{
		for (int j = 0; j < y_size; j++)
		{
			Vec3 color (0, 0, 0);
			for (float sX = 0; sX < 1; sX += 1.0 / sample_count)
			{
				for (float sY = 0; sY < 1; sY += 1.0 / sample_count)
				{
					float u = float (i + x_offset + sX) / float (width);
					float v = float (j + y_offset + sY) / float (height);

					Ray r = cam.get_ray (u, v);
					color += trace (r, world, 0);
				}
			}
			color /= static_cast<float> (sample_count * sample_count);

			framebuffer.set (i, j, vec_to_color (color));
		}
	}
	return framebuffer;
}